

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O0

int __thiscall bhf::ads::RegistryAccess::Export(RegistryAccess *this,string *firstKey,ostream *os)

{
  initializer_list<bhf::ads::RegistryEntry> __l;
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  const_iterator __position;
  reference pRVar4;
  const_iterator __first;
  const_iterator __last;
  size_type sVar5;
  reference pvVar6;
  RegistryEntry *local_1a0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_160;
  const_iterator local_158;
  reference local_150;
  RegistryEntry *newKey;
  iterator __end3_1;
  iterator __begin3_1;
  vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *__range3_1;
  const_iterator pendingKeysFront;
  RegistryEntry *value;
  iterator __end3;
  iterator __begin3;
  vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *__range3;
  value_type key;
  allocator<bhf::ads::RegistryEntry> local_95 [13];
  RegistryEntry *local_88;
  RegistryEntry local_80;
  undefined1 local_48 [24];
  list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> pendingKeys;
  ostream *os_local;
  string *firstKey_local;
  RegistryAccess *this_local;
  
  pendingKeys.super__List_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>.
  _M_impl._M_node._M_size = (size_t)os;
  poVar2 = std::operator<<(os,"Windows Registry Editor Version 5.00");
  std::operator<<(poVar2,"\n");
  local_88 = &local_80;
  RegistryEntry::Create(local_88,firstKey);
  local_48._0_8_ = &local_80;
  local_48._8_8_ = (pointer)0x1;
  std::allocator<bhf::ads::RegistryEntry>::allocator(local_95);
  __l._M_len = local_48._8_8_;
  __l._M_array = (iterator)local_48._0_8_;
  std::__cxx11::list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::list
            ((list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
             (local_48 + 0x10),__l,local_95);
  std::allocator<bhf::ads::RegistryEntry>::~allocator(local_95);
  local_1a0 = (RegistryEntry *)local_48;
  do {
    local_1a0 = local_1a0 + -1;
    RegistryEntry::~RegistryEntry(local_1a0);
  } while (local_1a0 != &local_80);
  while (bVar1 = std::__cxx11::
                 list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::empty
                           ((list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                             *)(local_48 + 0x10)), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::__cxx11::list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::
             front((list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
                   (local_48 + 0x10));
    RegistryEntry::RegistryEntry((RegistryEntry *)&__range3,pvVar3);
    std::__cxx11::list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::pop_front
              ((list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
               (local_48 + 0x10));
    RegistryEntry::Write
              ((RegistryEntry *)&__range3,
               (ostream *)
               pendingKeys.
               super__List_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>.
               _M_impl._M_node._M_size);
    Enumerate((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)&__begin3
              ,this,(RegistryEntry *)&__range3,0xc0000000,0x800);
    __end3 = std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::begin
                       ((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *
                        )&__begin3);
    value = (RegistryEntry *)
            std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::end
                      ((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
                       &__begin3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<bhf::ads::RegistryEntry_*,_std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>_>
                                       *)&value), bVar1) {
      pRVar4 = __gnu_cxx::
               __normal_iterator<bhf::ads::RegistryEntry_*,_std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>_>
               ::operator*(&__end3);
      RegistryEntry::Write
                (pRVar4,(ostream *)
                        pendingKeys.
                        super__List_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                        ._M_impl._M_node._M_size);
      __gnu_cxx::
      __normal_iterator<bhf::ads::RegistryEntry_*,_std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>_>
      ::operator++(&__end3);
    }
    key.dataLen._4_4_ = 4;
    std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~vector
              ((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
               &__begin3);
    __position = std::__cxx11::
                 list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::cbegin
                           ((list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                             *)(local_48 + 0x10));
    Enumerate((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
              &__begin3_1,this,(RegistryEntry *)&__range3,0,0x400);
    __end3_1 = std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::begin
                         ((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                           *)&__begin3_1);
    newKey = (RegistryEntry *)
             std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::end
                       ((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *
                        )&__begin3_1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<bhf::ads::RegistryEntry_*,_std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>_>
                               *)&newKey), bVar1) {
      pRVar4 = __gnu_cxx::
               __normal_iterator<bhf::ads::RegistryEntry_*,_std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>_>
               ::operator*(&__end3_1);
      local_150 = pRVar4;
      local_160._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              (&pRVar4->buffer);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_158,&local_160);
      __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range3);
      __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range3);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)pRVar4,local_158,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__last._M_current);
      pRVar4 = local_150;
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range3);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&pRVar4->buffer,sVar5 - 1);
      *pvVar6 = '\\';
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range3);
      local_150->keyLen = local_150->keyLen + sVar5;
      std::__cxx11::list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::insert
                ((list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
                 (local_48 + 0x10),__position,local_150);
      __gnu_cxx::
      __normal_iterator<bhf::ads::RegistryEntry_*,_std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>_>
      ::operator++(&__end3_1);
    }
    key.dataLen._4_4_ = 6;
    std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~vector
              ((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
               &__begin3_1);
    RegistryEntry::~RegistryEntry((RegistryEntry *)&__range3);
  }
  key.dataLen._4_4_ = 2;
  std::__cxx11::list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~list
            ((list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
             (local_48 + 0x10));
  std::operator<<((ostream *)
                  pendingKeys.
                  super__List_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                  ._M_impl._M_node._M_size,'\n');
  return 0;
}

Assistant:

int RegistryAccess::Export(const std::string& firstKey, std::ostream& os) const
{
    os << bhf::ads::WINDOWS_REGISTRY_HEADER << "\n";

    for (std::list<RegistryEntry> pendingKeys { RegistryEntry::Create(firstKey) }; !pendingKeys.empty(); ) {
        auto key = pendingKeys.front();
        pendingKeys.pop_front();
        key.Write(os);

        // First dump all the values of a key
        for (const auto& value: Enumerate(key, REGFLAG_ENUMVALUE_VTD, 0x800)) {
            value.Write(os);
        }

        // Then find all subkey and put them into a queue to omit recursion
        const auto pendingKeysFront = pendingKeys.cbegin();
        for (auto& newKey: Enumerate(key, REGFLAG_ENUMKEYS, 0x400)) {
            newKey.buffer.insert(newKey.buffer.begin(), key.buffer.cbegin(), key.buffer.cend());
            newKey.buffer[key.buffer.size() - 1] = '\\';
            newKey.keyLen += key.buffer.size();
            pendingKeys.insert(pendingKeysFront, newKey);
        }
    }
    os << '\n';
    return 0;
}